

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void emit_label(c2m_ctx_t c2m_ctx,node_t_conflict r)

{
  MIR_insn_t_conflict insn;
  
  if (r->code != N_LIST) {
    __assert_fail("labels->code == N_LIST",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2aee,"void emit_label(c2m_ctx_t, node_t)");
  }
  if ((r->u).s.s != (char *)0x0) {
    insn = (MIR_insn_t_conflict)r->attr;
    if (insn == (MIR_insn_t_conflict)0x0) {
      insn = MIR_new_label(c2m_ctx->ctx);
      r->attr = insn;
    }
    emit_label_insn_opt(c2m_ctx,insn);
    return;
  }
  return;
}

Assistant:

static void emit_label (c2m_ctx_t c2m_ctx, node_t r) {
  node_t labels = NL_HEAD (r->u.ops);

  assert (labels->code == N_LIST);
  if (NL_HEAD (labels->u.ops) == NULL) return;
  if (labels->attr == NULL) labels->attr = MIR_new_label (c2m_ctx->ctx);
  emit_label_insn_opt (c2m_ctx, labels->attr);
}